

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerResults.cpp
# Opt level: O2

void __thiscall
EnrichableI2cAnalyzerResults::GenerateFrameTabularText
          (EnrichableI2cAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  AddressDisplay AVar1;
  EnrichableAnalyzerSubprocess *this_00;
  bool bVar2;
  U64 packetId;
  ostream *poVar3;
  uint uVar4;
  ulonglong uVar5;
  string *tabularText;
  pointer pbVar6;
  char *local_2a0 [4];
  Frame frame;
  byte local_270;
  undefined7 uStack_26f;
  char local_260;
  byte local_25f;
  char ack [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tabularLines;
  char number_str [128];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)&frame);
  bVar2 = EnrichableAnalyzerSubprocess::TabularEnabled(this->mSubprocess);
  if (bVar2) {
    this_00 = this->mSubprocess;
    packetId = AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
    EnrichableAnalyzerSubprocess::EmitTabular_abi_cxx11_
              (&tabularLines,this_00,packetId,frame_index,&frame);
    for (pbVar6 = tabularLines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != tabularLines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      AnalyzerResults::AddTabularText
                ((char *)this,(pbVar6->_M_dataplus)._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tabularLines);
    goto LAB_0010ab71;
  }
  if ((local_25f & 1) == 0) {
    if ((local_25f & 2) == 0) {
      builtin_strncpy(ack,"NAK",4);
    }
    else {
      builtin_strncpy(ack,"Missing ACK/NAK",0x10);
    }
  }
  else {
    builtin_strncpy(ack,"ACK",4);
  }
  if (local_260 == '\0') {
    uVar4 = 8;
    AVar1 = this->mSettings->mAddressDisplay;
    if (AVar1 == YES_DIRECTION_8) {
      uVar5 = CONCAT71(uStack_26f,local_270);
LAB_0010aa4f:
      AnalyzerHelpers::GetNumberString(uVar5,display_base,uVar4,number_str,0x80);
    }
    else {
      if (AVar1 == NO_DIRECTION_8) {
        uVar5 = (ulonglong)((uint)CONCAT71(uStack_26f,local_270) & 0xfe);
        goto LAB_0010aa4f;
      }
      if (AVar1 == NO_DIRECTION_7) {
        uVar5 = CONCAT71(uStack_26f,local_270) >> 1;
        uVar4 = 7;
        goto LAB_0010aa4f;
      }
    }
    if ((local_270 & 1) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&tabularLines);
      poVar3 = std::operator<<((ostream *)
                               &tabularLines.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Setup Write to [");
      poVar3 = std::operator<<(poVar3,number_str);
      poVar3 = std::operator<<(poVar3,"] + ");
      std::operator<<(poVar3,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddTabularText
                ((char *)this,local_2a0[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&tabularLines);
      poVar3 = std::operator<<((ostream *)
                               &tabularLines.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,"Setup Read to ["
                              );
      poVar3 = std::operator<<(poVar3,number_str);
      poVar3 = std::operator<<(poVar3,"] + ");
      std::operator<<(poVar3,ack);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddTabularText
                ((char *)this,local_2a0[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else {
    AnalyzerHelpers::GetNumberString(CONCAT71(uStack_26f,local_270),display_base,8,number_str,0x80);
    std::__cxx11::stringstream::stringstream((stringstream *)&tabularLines);
    poVar3 = std::operator<<((ostream *)
                             &tabularLines.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,number_str);
    poVar3 = std::operator<<(poVar3," + ");
    std::operator<<(poVar3,ack);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddTabularText
              ((char *)this,local_2a0[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)local_2a0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&tabularLines);
LAB_0010ab71:
  Frame::~Frame(&frame);
  return;
}

Assistant:

void EnrichableI2cAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

	Frame frame = GetFrame( frame_index );

	if(mSubprocess->TabularEnabled()) {
		std::vector<std::string> tabularLines = mSubprocess->EmitTabular(
			GetPacketContainingFrameSequential( frame_index ),
			frame_index,
			frame
		);
		for(const std::string& tabularText: tabularLines) {
			AddTabularText(tabularText.c_str());
		}
	} else {
		char ack[32];
		if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
			snprintf( ack, sizeof(ack), "ACK" );
		else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
			snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
		else
			snprintf( ack, sizeof(ack), "NAK" );

		if( frame.mType == I2cAddress )
		{
			char number_str[128];
			switch( mSettings->mAddressDisplay )
			{
			case NO_DIRECTION_7:
				AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, number_str, 128 );
				break;
			case NO_DIRECTION_8:
				AnalyzerHelpers::GetNumberString( frame.mData1 & 0xFE, display_base, 8, number_str, 128 );
				break;
			case YES_DIRECTION_8:
				AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
				break;
			}

			I2cDirection direction;
			if( ( frame.mData1 & 0x1 ) != 0 )
				direction = I2C_READ;
			else
				direction = I2C_WRITE;

			if( direction == I2C_READ )
			{
				std::stringstream ss;
				ss << "Setup Read to [" << number_str << "] + " << ack;
				AddTabularText( ss.str().c_str() );
			}else
			{
				std::stringstream ss;
				ss << "Setup Write to [" << number_str << "] + " << ack;
				AddTabularText( ss.str().c_str() );
			}
		}else
		{
			char number_str[128];
			AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
			std::stringstream ss;
			ss << number_str << " + " << ack;
			AddTabularText( ss.str().c_str() );
		}
	}
}